

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

Wrench * __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::fromBodyFixedToUsedRepresentation
          (KinDynComputationsPrivateAttributes *this,Wrench *wrenchInBodyFixed,
          Transform *inertial_X_link)

{
  Wrench *pWVar1;
  Wrench *in_RCX;
  Wrench *in_RDX;
  long in_RSI;
  Rotation *in_RDI;
  
  if (*(int *)(in_RSI + 4) == 1) {
    iDynTree::Wrench::Wrench((Wrench *)in_RDI,in_RDX);
  }
  else if (*(int *)(in_RSI + 4) == 2) {
    pWVar1 = (Wrench *)iDynTree::Transform::getRotation();
    iDynTree::Rotation::operator*(in_RDI,pWVar1);
  }
  else {
    iDynTree::Transform::operator*((Transform *)in_RDI,in_RCX);
  }
  return (Wrench *)in_RDI;
}

Assistant:

Wrench KinDynComputations::KinDynComputationsPrivateAttributes::fromBodyFixedToUsedRepresentation(const Wrench & wrenchInBodyFixed,
                                                                                                  const Transform & inertial_X_link)
{
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return Wrench(wrenchInBodyFixed);
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        return inertial_X_link.getRotation()*wrenchInBodyFixed;
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        return inertial_X_link*wrenchInBodyFixed;
    }

    assert(false);
    return Wrench::Zero();
}